

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseElemExprListOpt(WastParser *this,ElemExprVector *out_list)

{
  pointer pEVar1;
  pointer pEVar2;
  bool bVar3;
  ElemExpr elem_expr;
  ElemExpr local_98;
  Location local_48;
  
  local_98.kind = RefNull;
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var(&local_98.var,0xffffffff,&local_48);
  bVar3 = ParseElemExprOpt(this,&local_98);
  if (bVar3) {
    do {
      std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back(out_list,&local_98);
      bVar3 = ParseElemExprOpt(this,&local_98);
    } while (bVar3);
  }
  pEVar1 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (out_list->super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Var::~Var(&local_98.var);
  return pEVar1 != pEVar2;
}

Assistant:

bool WastParser::ParseElemExprListOpt(ElemExprVector* out_list) {
  ElemExpr elem_expr;
  while (ParseElemExprOpt(&elem_expr)) {
    out_list->push_back(elem_expr);
  }
  return !out_list->empty();
}